

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void JS_AddIntrinsicDate(JSContext *ctx)

{
  JSValue *pJVar1;
  JSValue JVar2;
  
  pJVar1 = ctx->class_proto;
  JVar2 = JS_NewObjectProtoClass(ctx,pJVar1[1],1);
  pJVar1[10] = JVar2;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[10],js_date_proto_funcs,0x2f);
  JVar2 = JS_NewGlobalCConstructor(ctx,"Date",js_date_constructor,7,ctx->class_proto[10]);
  JS_SetPropertyFunctionList(ctx,JVar2,js_date_funcs,3);
  return;
}

Assistant:

void JS_AddIntrinsicDate(JSContext *ctx)
{
    JSValueConst obj;

    /* Date */
    ctx->class_proto[JS_CLASS_DATE] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_DATE], js_date_proto_funcs,
                               countof(js_date_proto_funcs));
    obj = JS_NewGlobalCConstructor(ctx, "Date", js_date_constructor, 7,
                                   ctx->class_proto[JS_CLASS_DATE]);
    JS_SetPropertyFunctionList(ctx, obj, js_date_funcs, countof(js_date_funcs));
}